

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

void ncnn::convert_packing(Mat *src,Mat *dst,int _packing,Allocator *allocator,int num_threads)

{
  Layer *pLVar1;
  Option opt;
  ParamDict pd;
  
  pLVar1 = create_layer(0x3e);
  ParamDict::ParamDict(&pd);
  ParamDict::set(&pd,0,_packing);
  (*pLVar1->_vptr_Layer[2])(pLVar1,&pd);
  get_default_option();
  (*pLVar1->_vptr_Layer[7])(pLVar1,src,dst);
  (*pLVar1->_vptr_Layer[1])(pLVar1);
  ParamDict::~ParamDict(&pd);
  return;
}

Assistant:

void convert_packing(const Mat& src, Mat& dst, int _packing, Allocator* allocator, int num_threads)
{
    ncnn::Layer* packing = ncnn::create_layer(ncnn::LayerType::Packing);

    ncnn::ParamDict pd;
    pd.set(0, _packing);

    packing->load_param(pd);

    ncnn::Option opt = ncnn::get_default_option();
    opt.num_threads = num_threads;
    opt.blob_allocator = allocator;

    packing->forward(src, dst, opt);

    delete packing;
}